

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  cmListFileContext *pcVar5;
  string *this_00;
  string_view str;
  string line;
  undefined1 local_b8 [48];
  undefined1 local_88 [32];
  cmAlphaNum local_68;
  string local_38;
  
  psVar3 = (string *)local_b8;
  this_00 = (string *)local_b8;
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((this->FileLine < 0) || (iVar2 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar2 != 0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,var,(allocator<char> *)&local_68);
    psVar3 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    if (psVar3 == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b8,var,(allocator<char> *)&local_68);
      cmMakefile::MaybeWarnUninitialized(pcVar1,(string *)local_b8,this->FileName);
      std::__cxx11::string::~string((string *)local_b8);
      if (this->RemoveEmpty == false) {
        return (char *)0x0;
      }
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    else if (this->EscapeQuotes == true) {
      str._M_str = (psVar3->_M_dataplus)._M_p;
      str._M_len = psVar3->_M_string_length;
      cmEscapeQuotes_abi_cxx11_((string *)local_b8,str);
      pcVar4 = AddString(this,(string *)local_b8);
      goto LAB_00375ee4;
    }
    pcVar4 = AddString(this,psVar3);
  }
  else {
    local_88._0_8_ = local_b8 + 0x40;
    local_88._8_8_ = (_Elt_pointer)0x0;
    local_88[0x10] = 0;
    cmMakefile::GetBacktrace((cmMakefile *)local_b8);
    pcVar5 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    if ((pcVar5->DeferId).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      local_b8._0_8_ = &DAT_00000009;
      local_b8._8_8_ = "DEFERRED:";
      local_68.View_._M_str =
           (pcVar5->DeferId).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_dataplus._M_p;
      local_68.View_._M_len =
           (pcVar5->DeferId).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      cmStrCat<>(&local_38,(cmAlphaNum *)local_b8,&local_68);
      psVar3 = &local_38;
    }
    else {
      std::__cxx11::to_string((string *)local_b8,this->FileLine);
    }
    std::__cxx11::string::operator=((string *)(local_b8 + 0x30),(string *)psVar3);
    std::__cxx11::string::~string((string *)psVar3);
    pcVar4 = AddString(this,(string *)(local_b8 + 0x30));
    this_00 = (string *)(local_b8 + 0x30);
LAB_00375ee4:
    std::__cxx11::string::~string(this_00);
  }
  return pcVar4;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::string line;
    cmListFileContext const& top = this->Makefile->GetBacktrace().Top();
    if (top.DeferId) {
      line = cmStrCat("DEFERRED:"_s, *top.DeferId);
    } else {
      line = std::to_string(this->FileLine);
    }
    return this->AddString(line);
  }
  cmValue value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmEscapeQuotes(*value));
  }
  return this->AddString(value);
}